

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteTriggerStep(sqlite3 *db,TriggerStep *pTriggerStep)

{
  sqlite3 *in_RSI;
  ExprList *in_RDI;
  TriggerStep *pTmp;
  sqlite3 *db_00;
  
  while (in_RSI != (sqlite3 *)0x0) {
    db_00 = *(sqlite3 **)&in_RSI->openFlags;
    sqlite3ExprDelete(db_00,(Expr *)in_RSI);
    sqlite3ExprListDelete((sqlite3 *)pTmp,in_RDI);
    sqlite3SelectDelete(db_00,(Select *)in_RSI);
    sqlite3IdListDelete(db_00,(IdList *)in_RSI);
    sqlite3DbFree(db_00,in_RSI);
    in_RSI = db_00;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteTriggerStep(sqlite3 *db, TriggerStep *pTriggerStep){
  while( pTriggerStep ){
    TriggerStep * pTmp = pTriggerStep;
    pTriggerStep = pTriggerStep->pNext;

    sqlite3ExprDelete(db, pTmp->pWhere);
    sqlite3ExprListDelete(db, pTmp->pExprList);
    sqlite3SelectDelete(db, pTmp->pSelect);
    sqlite3IdListDelete(db, pTmp->pIdList);

    sqlite3DbFree(db, pTmp);
  }
}